

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::emitUnreachable
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this)

{
  BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this_local;
  
  anon_unknown_13::Poppifier::emitUnreachable((Poppifier *)this);
  return;
}

Assistant:

void emitUnreachable() { static_cast<SubType*>(this)->emitUnreachable(); }